

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int ly_set_contains(ly_set *set,void *node)

{
  uint local_24;
  uint i;
  void *node_local;
  ly_set *set_local;
  
  if (set != (ly_set *)0x0) {
    for (local_24 = 0; local_24 < set->number; local_24 = local_24 + 1) {
      if ((set->set).s[local_24] == (lys_node *)node) {
        return local_24;
      }
    }
  }
  return -1;
}

Assistant:

API int
ly_set_contains(const struct ly_set *set, void *node)
{
    unsigned int i;

    if (!set) {
        return -1;
    }

    for (i = 0; i < set->number; i++) {
        if (set->set.g[i] == node) {
            /* object found */
            return i;
        }
    }

    /* object not found */
    return -1;
}